

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetResponseFlag_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,ResponseFlagFor mode)

{
  cmGeneratorTarget *this_00;
  cmValue cVar1;
  string responseFlagVar;
  string lang;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"@",(allocator<char> *)&local_80);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_60,this);
  cmGeneratorTarget::GetLinkerLanguage(&local_40,this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (mode == DeviceLink) {
    std::__cxx11::string::assign((char *)&local_80);
  }
  else if (mode == Link) {
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[25]>
              (&local_60,(char (*) [7])0x6cf18b,&local_40,(char (*) [25])"_RESPONSE_FILE_LINK_FLAG")
    ;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  cVar1 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_80);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetResponseFlag(
  ResponseFlagFor mode) const
{
  std::string responseFlag = "@";
  std::string responseFlagVar;

  auto const lang =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  if (mode == cmMakefileTargetGenerator::ResponseFlagFor::Link) {
    responseFlagVar = cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_LINK_FLAG");
  } else if (mode == cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink) {
    responseFlagVar = "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG";
  }

  if (cmValue const p = this->Makefile->GetDefinition(responseFlagVar)) {
    responseFlag = *p;
  }
  return responseFlag;
}